

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_member(CTcPrsNode *lhs)

{
  tc_toktyp_t tVar1;
  _func_int **pp_Var2;
  CTcPrsNode *pCVar3;
  CTPNArglist *pCVar4;
  CTcPrsNode *pCVar5;
  undefined *puVar6;
  byte bVar7;
  
  if ((G_tok->curtok_).typ_ == TOKT_DOT) {
    CTcTokenizer::next(G_tok);
    tVar1 = (G_tok->curtok_).typ_;
    if (tVar1 == TOKT_TARGETPROP) {
      CTcTokenizer::next(G_tok);
      goto LAB_00200901;
    }
    if (tVar1 != TOKT_LPAR) {
      if (tVar1 != TOKT_SYM) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b0b);
        CTcTokenizer::next(G_tok);
        return lhs;
      }
      pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
      pp_Var2 = (_func_int **)(G_tok->curtok_).text_len_;
      pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)(G_tok->curtok_).text_;
      pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
      (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031fae8;
      CTcTokenizer::next(G_tok);
      bVar7 = 0;
      goto LAB_0020093d;
    }
    CTcTokenizer::next(G_tok);
    pCVar3 = CTcPrsOpBin::parse(&S_op_comma.super_CTcPrsOpBin);
    if (pCVar3 != (CTcPrsNode *)0x0) {
      if ((G_tok->curtok_).typ_ != TOKT_RPAR) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b04);
        tVar1 = (G_tok->curtok_).typ_;
        if (tVar1 == TOKT_EOF) {
          return lhs;
        }
        bVar7 = 1;
        if (tVar1 == TOKT_SEM) {
          return lhs;
        }
        goto LAB_0020093d;
      }
      CTcTokenizer::next(G_tok);
      goto LAB_0020093a;
    }
LAB_002009c6:
    pCVar5 = (CTcPrsNode *)0x0;
  }
  else {
LAB_00200901:
    pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,8);
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003218f8;
    G_prs->full_method_ctx_referenced_ = 1;
LAB_0020093a:
    bVar7 = 1;
LAB_0020093d:
    if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
      pCVar4 = parse_arg_list();
      if (pCVar4 == (CTPNArglist *)0x0) goto LAB_002009c6;
      pCVar5 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x28);
      pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lhs;
      pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
      *(byte *)&pCVar5[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           *(byte *)&pCVar5[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe | bVar7;
      puVar6 = &CTPNMemArg::vtable;
    }
    else {
      pCVar5 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
      pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lhs;
      pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           *(byte *)&pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe | bVar7;
      puVar6 = &CTPNMember::vtable;
    }
    (pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar6 + 0x10);
  }
  return pCVar5;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_member(CTcPrsNode *lhs)
{
    CTcPrsNode *rhs;
    int rhs_is_expr;

    /*
     *   If a '.' is present, skip it; otherwise, '.targetprop' is implied. 
     */
    if (G_tok->cur() == TOKT_DOT)
    {
        /* we have an explicit property expression - skip the '.' */
        G_tok->next();

        /* assume the property will be a simple symbol, not an expression */
        rhs_is_expr = FALSE;

        /* we could have a symbol or a parenthesized expression */
        switch(G_tok->cur())
        {
        case TOKT_SYM:
            /* 
             *   It's a simple property name - create a symbol node.  Note
             *   that we must explicitly create an unresolved symbol node,
             *   since we want to ignore any local variable with the same
             *   name and look only in the global symbol table for a
             *   property; we must hence defer resolving the symbol until
             *   code generation.  
             */
            rhs = new CTPNSym(G_tok->getcur()->get_text(),
                              G_tok->getcur()->get_text_len());
            
            /* skip the symbol token */
            G_tok->next();
            
            /* proceed to check for an argument list */
            break;
            
        case TOKT_LPAR:
            /* 
             *   It's a parenthesized expression - parse it.  First, skip
             *   the open paren - we don't want the sub-expression to go
             *   beyond the close paren (if we didn't skip the open paren,
             *   the open paren would be part of the sub-expression, hence
             *   any postfix expression after the close paren would be
             *   considered part of the sub-expression; this would be
             *   invalid, since we might want to find a postfix actual
             *   parameter list).  
             */
            G_tok->next();
            
            /* remember that it's an expression */
            rhs_is_expr = TRUE;
            
            /* parse the sub-expression */
            rhs = S_op_comma.parse();
            if (rhs == 0)
                return 0;
            
            /* require the close paren */
            if (G_tok->cur() == TOKT_RPAR)
            {
                /* skip the closing paren */
                G_tok->next();
            }
            else
            {
                /* log the error */
                G_tok->log_error_curtok(TCERR_EXPR_MISSING_RPAR);
                
                /* 
                 *   if we're at a semicolon or end of file, we must be on
                 *   to the next statement - stop trying to parse this one
                 *   if so; otherwise, continue on the assumption that they
                 *   merely left out the close paren and what follows is
                 *   more expression for us to process 
                 */
                if (G_tok->cur() == TOKT_SEM || G_tok->cur() == TOKT_EOF)
                    return lhs;
            }
            break;
            
        case TOKT_TARGETPROP:
            /* 
             *   it's an unparenthesized "targetprop" expression - skip the
             *   keyword 
             */
            G_tok->next();
            
            /* 
             *   the property value is the result of evaluating
             *   "targetprop", which is an expression 
             */
            rhs = new CTPNTargetprop();
            rhs_is_expr = TRUE;

            /* note the reference to the extended method context */
            G_prs->set_full_method_ctx_referenced(TRUE);

            /* go parse the rest */
            break;
            
        default:
            /* anything else is invalid - log an error */
            G_tok->log_error_curtok(TCERR_INVALID_PROP_EXPR);
            
            /* skip the errant token so we don't loop on it */
            G_tok->next();
            
            /* return what we have so far */
            return lhs;
        }
    }
    else
    {
        /* there's no property specified, so '.targetprop' is implied */
        rhs = new CTPNTargetprop();
        rhs_is_expr = TRUE;

        /* 
         *   note the reference to the full method context (since
         *   'targetprop' is part of the extended method context beyond
         *   'self') 
         */
        G_prs->set_full_method_ctx_referenced(TRUE);
    }
        
    /* check for an argument list */
    if (G_tok->cur() == TOKT_LPAR)
    {
        CTPNArglist *arglist;
        
        /* parse the argument list */
        arglist = parse_arg_list();
        if (arglist == 0)
            return 0;

        /* create and return a member-with-arguments node */
        return new CTPNMemArg(lhs, rhs, rhs_is_expr, arglist);
    }
    else
    {
        /* 
         *   there's no argument list - create and return a simple member
         *   node 
         */
        return new CTPNMember(lhs, rhs, rhs_is_expr);
    }
}